

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_engine.hpp
# Opt level: O2

State * __thiscall
chaiscript::ChaiScript_Basic::get_state(State *__return_storage_ptr__,ChaiScript_Basic *this)

{
  shared_lock<chaiscript::detail::threading::shared_mutex> l2;
  shared_lock<std::shared_mutex> local_f0;
  State local_e0;
  
  Catch::clara::std::recursive_mutex::lock(&this->m_use_mutex);
  local_f0._M_pm = &this->m_mutex;
  local_f0._M_owns = true;
  Catch::clara::std::__shared_mutex_pthread::lock_shared(&(local_f0._M_pm)->_M_impl);
  State::State(__return_storage_ptr__);
  Catch::clara::std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)__return_storage_ptr__,&(this->m_used_files)._M_t);
  detail::Dispatch_Engine::get_state(&local_e0,&this->m_engine);
  detail::Dispatch_Engine::State::operator=(&__return_storage_ptr__->engine_state,&local_e0);
  detail::Dispatch_Engine::State::~State(&local_e0);
  Catch::clara::std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&(__return_storage_ptr__->active_loaded_modules)._M_t,
              &(this->m_active_loaded_modules)._M_t);
  Catch::clara::std::shared_lock<std::shared_mutex>::~shared_lock(&local_f0);
  pthread_mutex_unlock((pthread_mutex_t *)&this->m_use_mutex);
  return __return_storage_ptr__;
}

Assistant:

State get_state() const {
      chaiscript::detail::threading::lock_guard<chaiscript::detail::threading::recursive_mutex> l(m_use_mutex);
      chaiscript::detail::threading::shared_lock<chaiscript::detail::threading::shared_mutex> l2(m_mutex);

      State s;
      s.used_files = m_used_files;
      s.engine_state = m_engine.get_state();
      s.active_loaded_modules = m_active_loaded_modules;
      return s;
    }